

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O0

void __thiscall
FilereaderLp::writeToFileMatrixRow
          (FilereaderLp *this,FILE *file,HighsInt iRow,HighsSparseMatrix *ar_matrix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *col_names)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  long in_RCX;
  int in_EDX;
  FilereaderLp *in_RSI;
  FilereaderLp *in_RDI;
  FILE *in_R8;
  double coef;
  HighsInt iCol;
  HighsInt iEl;
  bool has_col_names;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  FilereaderLp *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int iVar5;
  FILE *file_00;
  string local_60 [32];
  value_type local_40;
  value_type local_34;
  int local_30;
  byte local_29;
  int local_14;
  FilereaderLp *local_10;
  
  file_00 = in_R8;
  local_14 = in_EDX;
  local_10 = in_RSI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_R8);
  local_29 = sVar1 != 0;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RCX + 0x10),(long)local_14);
  local_30 = *pvVar2;
  while( true ) {
    iVar5 = local_30;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RCX + 0x10),(long)(local_14 + 1));
    if (*pvVar2 <= iVar5) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RCX + 0x40),(long)local_30);
    local_34 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x58),(long)local_30);
    local_40 = *pvVar3;
    writeToFileValue((FilereaderLp *)in_R8,(FILE *)CONCAT44(iVar5,in_stack_ffffffffffffff78),
                     (double)in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
    if ((local_29 & 1) == 0) {
      writeToFileVar(in_stack_ffffffffffffff70,
                     (FILE *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),0);
    }
    else {
      in_stack_ffffffffffffff70 = local_10;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)file_00,(long)local_34);
      std::__cxx11::string::string(local_60,(string *)pvVar4);
      writeToFileVar(in_RDI,file_00,(string *)in_R8);
      std::__cxx11::string::~string(local_60);
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void FilereaderLp::writeToFileMatrixRow(FILE* file, const HighsInt iRow,
                                        const HighsSparseMatrix ar_matrix,
                                        const std::vector<string> col_names) {
  assert(ar_matrix.isRowwise());
  const bool has_col_names = allow_model_names && col_names.size() > 0;

  for (HighsInt iEl = ar_matrix.start_[iRow]; iEl < ar_matrix.start_[iRow + 1];
       iEl++) {
    HighsInt iCol = ar_matrix.index_[iEl];
    double coef = ar_matrix.value_[iEl];
    this->writeToFileValue(file, coef);
    if (has_col_names) {
      this->writeToFileVar(file, col_names[iCol]);
    } else {
      this->writeToFileVar(file, iCol);
    }
  }
}